

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_avsd_vdpu2.c
# Opt level: O3

MPP_RET hal_avsd_vdpu2_control(void *decoder,MpiCmd cmd_type,void *param)

{
  if (((byte)avsd_hal_debug & 8) != 0) {
    _mpp_log_l(4,"hal_avsd_vdpu2","In.","hal_avsd_vdpu2_control");
    if (((byte)avsd_hal_debug & 8) != 0) {
      _mpp_log_l(4,"hal_avsd_vdpu2","Out.","hal_avsd_vdpu2_control");
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_avsd_vdpu2_control(void *decoder, MpiCmd cmd_type, void *param)
{
    MPP_RET ret = MPP_ERR_UNKNOW;

    AVSD_HAL_TRACE("In.");

    (void)decoder;
    (void)cmd_type;
    (void)param;

    AVSD_HAL_TRACE("Out.");

    return ret = MPP_OK;
}